

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

void Gia_Sim2Delete(Gia_Sim2_t *p)

{
  Gia_Sim2_t *p_local;
  
  Vec_IntFreeP(&p->vClassOld);
  Vec_IntFreeP(&p->vClassNew);
  if (p->pDataSim != (uint *)0x0) {
    free(p->pDataSim);
    p->pDataSim = (uint *)0x0;
  }
  if (p != (Gia_Sim2_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Gia_Sim2Delete( Gia_Sim2_t * p )
{
    Vec_IntFreeP( &p->vClassOld );
    Vec_IntFreeP( &p->vClassNew );
    ABC_FREE( p->pDataSim );
    ABC_FREE( p );
}